

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::GeneratorAction::operator()
          (GeneratorAction *this,cmLocalGenerator *lg,cmListFileBacktrace *lfbt)

{
  cmListFileBacktrace *__args_1;
  cmListFileBacktrace *__args;
  bool bVar1;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_28;
  cmListFileBacktrace *local_20;
  cmListFileBacktrace *lfbt_local;
  cmLocalGenerator *lg_local;
  GeneratorAction *this_local;
  
  local_20 = lfbt;
  lfbt_local = (cmListFileBacktrace *)lg;
  lg_local = (cmLocalGenerator *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->cc);
  __args = lfbt_local;
  __args_1 = local_20;
  if (bVar1) {
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_28,&this->cc);
    std::
    function<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)>
    ::operator()(&this->CCAction,(cmLocalGenerator *)__args,__args_1,&local_28);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_28);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)this);
    if (!bVar1) {
      __assert_fail("Action",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                    ,0x3aa,
                    "void cmMakefile::GeneratorAction::operator()(cmLocalGenerator &, const cmListFileBacktrace &)"
                   );
    }
    std::function<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&)>::operator()
              (&this->Action,(cmLocalGenerator *)lfbt_local,local_20);
  }
  return;
}

Assistant:

void cmMakefile::GeneratorAction::operator()(cmLocalGenerator& lg,
                                             const cmListFileBacktrace& lfbt)
{
  if (cc) {
    CCAction(lg, lfbt, std::move(cc));
  } else {
    assert(Action);
    Action(lg, lfbt);
  }
}